

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

char * path_elem(char *path,char *buff,char *sep)

{
  char cVar1;
  _Bool _Var2;
  char *pcStack_38;
  char ch;
  char *bptr;
  char *ptr;
  char *sep_local;
  char *buff_local;
  char *path_local;
  
  pcStack_38 = buff;
  bptr = path;
  ptr = sep;
  sep_local = buff;
  buff_local = path;
  while( true ) {
    cVar1 = *bptr;
    if (cVar1 == '\0') {
      if (pcStack_38 == sep_local) {
        path_local = (char *)0x0;
      }
      else {
        *pcStack_38 = '\0';
        path_local = bptr;
      }
      return path_local;
    }
    _ecs_assert((long)pcStack_38 - (long)sep_local < 0x40,2,(char *)0x0,
                "bptr - buff < ECS_MAX_NAME_LENGTH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                ,0xf1);
    if (0x3f < (long)pcStack_38 - (long)sep_local) break;
    _Var2 = is_sep(&bptr,ptr);
    if (_Var2) {
      *pcStack_38 = '\0';
      return bptr + 1;
    }
    *pcStack_38 = cVar1;
    pcStack_38 = pcStack_38 + 1;
    bptr = bptr + 1;
  }
  __assert_fail("bptr - buff < (64)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                ,0xf1,"const char *path_elem(const char *, char *, const char *)");
}

Assistant:

static
const char *path_elem(
    const char *path,
    char *buff,
    const char *sep)
{
    const char *ptr;
    char *bptr, ch;

    for (bptr = buff, ptr = path; (ch = *ptr); ptr ++) {
        ecs_assert(bptr - buff < ECS_MAX_NAME_LENGTH, ECS_INVALID_PARAMETER, 
            NULL);
            
        if (is_sep(&ptr, sep)) {
            *bptr = '\0';
            return ptr + 1;
        } else {
            *bptr = ch;
            bptr ++;
        }
    }

    if (bptr != buff) {
        *bptr = '\0';
        return ptr;
    } else {
        return NULL;
    }
}